

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_layout.cpp
# Opt level: O2

void __thiscall
duckdb::TupleDataLayout::Initialize
          (TupleDataLayout *this,Aggregates *aggregates_p,bool align,bool heap_offset_p)

{
  vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_> local_48;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_28;
  
  local_28.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (aggregates_p->
       super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>).
       super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_48.super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (aggregates_p->
       super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>).
       super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (aggregates_p->
       super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>).
       super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (aggregates_p->super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>).
  super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (aggregates_p->super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>).
  super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (aggregates_p->super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>).
  super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Initialize(this,(vector<duckdb::LogicalType,_true> *)&local_28,(Aggregates *)&local_48,align,
             heap_offset_p);
  ::std::vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>::~vector
            (&local_48);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_28);
  return;
}

Assistant:

void TupleDataLayout::Initialize(Aggregates aggregates_p, bool align, bool heap_offset_p) {
	Initialize(vector<LogicalType>(), std::move(aggregates_p), align, heap_offset_p);
}